

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O1

REF_STATUS
ref_shard_add_pri_as_tet(REF_NODE ref_node,REF_CELL ref_cell,REF_INT *nodes,REF_BOOL check_volume)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  double dVar11;
  long lVar12;
  REF_DBL vol_1;
  REF_INT pri_nodes [27];
  REF_INT tet_nodes [27];
  REF_GLOB pri_global [27];
  REF_GLOB global [27];
  double local_2e8;
  uint *local_2e0;
  long local_2d8;
  int local_2cc;
  uint local_2c8 [28];
  uint local_258;
  uint local_254;
  uint local_250;
  uint local_24c;
  double local_1e8;
  long local_1e0;
  long local_1d8;
  long local_1c8;
  long local_1c0;
  long local_108 [27];
  
  lVar10 = 0;
  do {
    iVar1 = nodes[lVar10];
    lVar12 = -1;
    if (((-1 < (long)iVar1) && (iVar1 < ref_node->max)) &&
       (lVar12 = ref_node->global[iVar1], lVar12 < 0)) {
      lVar12 = -1;
    }
    local_108[lVar10] = lVar12;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 6);
  if (local_108[1] <= local_108[0]) {
    local_108[0] = local_108[1];
  }
  lVar10 = local_108[3];
  if (local_108[2] < local_108[3]) {
    lVar10 = local_108[2];
  }
  if (local_108[0] < lVar10) {
    lVar10 = local_108[0];
  }
  local_2d8 = local_108[5];
  if (local_108[4] < local_108[5]) {
    local_2d8 = local_108[4];
  }
  if (lVar10 <= local_2d8) {
    local_2d8 = lVar10;
  }
  uVar2 = *nodes;
  uVar3 = nodes[1];
  uVar4 = nodes[2];
  uVar5 = nodes[3];
  uVar6 = nodes[4];
  uVar7 = nodes[5];
  local_2c8[0] = uVar2;
  local_2c8[1] = uVar3;
  local_2c8[2] = uVar4;
  local_2c8[3] = uVar5;
  local_2c8[4] = uVar6;
  local_2c8[5] = uVar7;
  if (local_108[1] == local_2d8) {
    local_2c8[0] = uVar3;
    local_2c8[1] = uVar4;
    local_2c8[2] = uVar2;
    local_2c8[3] = uVar6;
    local_2c8[4] = uVar7;
    local_2c8[5] = uVar5;
  }
  if (local_108[2] == local_2d8) {
    local_2c8[0] = uVar4;
    local_2c8[1] = uVar2;
    local_2c8[2] = uVar3;
    local_2c8[3] = uVar7;
    local_2c8[4] = uVar5;
    local_2c8[5] = uVar6;
  }
  if (local_108[3] == local_2d8) {
    local_2c8[0] = uVar5;
    local_2c8[1] = uVar7;
    local_2c8[2] = uVar6;
    local_2c8[3] = uVar2;
    local_2c8[4] = uVar4;
    local_2c8[5] = uVar3;
  }
  if (local_108[4] == local_2d8) {
    local_2c8[0] = uVar6;
    local_2c8[1] = uVar5;
    local_2c8[2] = uVar7;
    local_2c8[3] = uVar3;
    local_2c8[4] = uVar2;
    local_2c8[5] = uVar4;
  }
  if (local_108[5] == local_2d8) {
    local_2c8[0] = uVar7;
    local_2c8[1] = uVar6;
    local_2c8[2] = uVar5;
    local_2c8[3] = uVar4;
    local_2c8[4] = uVar3;
    local_2c8[5] = uVar2;
  }
  uVar5 = local_2c8[5];
  uVar4 = local_2c8[4];
  uVar3 = local_2c8[3];
  uVar2 = local_2c8[0];
  local_258 = local_2c8[0];
  local_254 = local_2c8[4];
  local_250 = local_2c8[5];
  local_24c = local_2c8[3];
  local_2e0 = (uint *)nodes;
  local_2cc = check_volume;
  uVar6 = ref_shard_cell_add_local(ref_node,ref_cell,(REF_INT *)&local_258);
  iVar1 = local_2cc;
  if (uVar6 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x225,
           "ref_shard_add_pri_as_tet",(ulong)uVar6,"add tet");
    return uVar6;
  }
  if (local_2cc != 0) {
    uVar6 = ref_node_tet_vol(ref_node,(REF_INT *)&local_258,&local_1e8);
    if (uVar6 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x226
             ,"ref_shard_add_pri_as_tet",(ulong)uVar6,"tet vol");
      return uVar6;
    }
    if (local_1e8 <= 0.0) {
      printf("tet vol %e\n");
      printf("minnode %ld\n",local_2d8);
      printf("nodes %d %d %d %d %d %d\n",(ulong)*local_2e0,(ulong)local_2e0[1],(ulong)local_2e0[2],
             (ulong)local_2e0[3],(ulong)local_2e0[4],local_2e0[5]);
      printf("prism %d %d %d %d %d %d\n",(ulong)uVar2,(ulong)local_2c8[1],(ulong)local_2c8[2],
             (ulong)uVar3,(ulong)uVar4,uVar5);
      printf("tet %d %d %d %d\n",(ulong)local_258,(ulong)local_254,(ulong)local_250,(ulong)local_24c
            );
    }
  }
  uVar6 = local_2c8[2];
  uVar7 = local_2c8[1];
  lVar10 = 0;
  do {
    uVar8 = local_2c8[lVar10];
    dVar11 = -NAN;
    if (((-1 < (long)(int)uVar8) && ((int)uVar8 < ref_node->max)) &&
       (dVar11 = (double)ref_node->global[(int)uVar8], (long)dVar11 < 0)) {
      dVar11 = -NAN;
    }
    (&local_1e8)[lVar10] = dVar11;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 6);
  if ((local_1e0 < local_1d8 && local_1e0 < local_1c8) ||
     (local_1c0 < local_1c8 && local_1c0 < local_1d8)) {
    local_258 = uVar2;
    local_254 = local_2c8[1];
    local_250 = uVar5;
    local_24c = uVar4;
    uVar6 = ref_shard_cell_add_local(ref_node,ref_cell,(REF_INT *)&local_258);
    if (uVar6 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x231
             ,"ref_shard_add_pri_as_tet",(ulong)uVar6,"a tet");
      return uVar6;
    }
    if (iVar1 != 0) {
      uVar6 = ref_node_tet_vol(ref_node,(REF_INT *)&local_258,&local_2e8);
      if (uVar6 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
               0x232,"ref_shard_add_pri_as_tet",(ulong)uVar6,"tet vol");
        return uVar6;
      }
      if (local_2e8 <= 0.0) {
        printf("tet vol %e\n");
        printf("minnode %ld\n",local_2d8);
        printf("nodes %d %d %d %d %d %d\n",(ulong)*local_2e0,(ulong)local_2e0[1],(ulong)local_2e0[2]
               ,(ulong)local_2e0[3],(ulong)local_2e0[4],local_2e0[5]);
        printf("prism %d %d %d %d %d %d\n",(ulong)uVar2,(ulong)uVar7,(ulong)local_2c8[2],
               (ulong)uVar3,(ulong)uVar4,uVar5);
        printf("tet %d %d %d %d\n",(ulong)local_258,(ulong)local_254,(ulong)local_250,
               (ulong)local_24c);
      }
    }
    uVar6 = local_2c8[2];
    local_258 = uVar2;
    local_254 = uVar7;
    local_250 = local_2c8[2];
    local_24c = uVar5;
    uVar8 = ref_shard_cell_add_local(ref_node,ref_cell,(REF_INT *)&local_258);
    if (uVar8 == 0) {
      uVar9 = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x238
             ,"ref_shard_add_pri_as_tet",(ulong)uVar8,"a tet");
      uVar9 = uVar8;
    }
    if (iVar1 == 0 || uVar8 != 0) {
      return uVar9;
    }
    uVar8 = ref_node_tet_vol(ref_node,(REF_INT *)&local_258,&local_2e8);
    if (uVar8 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x239
             ,"ref_shard_add_pri_as_tet",(ulong)uVar8,"tet vol");
      return uVar8;
    }
    if (0.0 < local_2e8) {
      return 0;
    }
    printf("tet vol %e\n");
    printf("minnode %ld\n",local_2d8);
    printf("nodes %d %d %d %d %d %d\n",(ulong)*local_2e0,(ulong)local_2e0[1],(ulong)local_2e0[2],
           (ulong)local_2e0[3],(ulong)local_2e0[4],local_2e0[5]);
  }
  else {
    local_258 = local_2c8[2];
    local_254 = uVar2;
    local_250 = uVar4;
    local_24c = uVar5;
    uVar7 = ref_shard_cell_add_local(ref_node,ref_cell,(REF_INT *)&local_258);
    if (uVar7 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x23f
             ,"ref_shard_add_pri_as_tet",(ulong)uVar7,"a tet");
      return uVar7;
    }
    if (iVar1 != 0) {
      uVar7 = ref_node_tet_vol(ref_node,(REF_INT *)&local_258,&local_2e8);
      if (uVar7 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
               0x240,"ref_shard_add_pri_as_tet",(ulong)uVar7,"tet vol");
        return uVar7;
      }
      if (local_2e8 <= 0.0) {
        printf("tet vol %e\n");
        printf("minnode %ld\n",local_2d8);
        printf("nodes %d %d %d %d %d %d\n",(ulong)*local_2e0,(ulong)local_2e0[1],(ulong)local_2e0[2]
               ,(ulong)local_2e0[3],(ulong)local_2e0[4],local_2e0[5]);
        printf("prism %d %d %d %d %d %d\n",(ulong)uVar2,(ulong)local_2c8[1],(ulong)uVar6,
               (ulong)uVar3,(ulong)uVar4,uVar5);
        printf("tet %d %d %d %d\n",(ulong)local_258,(ulong)local_254,(ulong)local_250,
               (ulong)local_24c);
      }
    }
    uVar7 = local_2c8[1];
    local_258 = uVar2;
    local_254 = local_2c8[1];
    local_250 = uVar6;
    local_24c = uVar4;
    uVar8 = ref_shard_cell_add_local(ref_node,ref_cell,(REF_INT *)&local_258);
    if (uVar8 == 0) {
      uVar9 = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x246
             ,"ref_shard_add_pri_as_tet",(ulong)uVar8,"a tet");
      uVar9 = uVar8;
    }
    if (iVar1 == 0 || uVar8 != 0) {
      return uVar9;
    }
    uVar8 = ref_node_tet_vol(ref_node,(REF_INT *)&local_258,&local_2e8);
    if (uVar8 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x247
             ,"ref_shard_add_pri_as_tet",(ulong)uVar8,"tet vol");
      return uVar8;
    }
    if (0.0 < local_2e8) {
      return 0;
    }
    printf("tet vol %e\n");
    printf("minnode %ld\n",local_2d8);
    printf("nodes %d %d %d %d %d %d\n",(ulong)*local_2e0,(ulong)local_2e0[1],(ulong)local_2e0[2],
           (ulong)local_2e0[3],(ulong)local_2e0[4],local_2e0[5]);
  }
  printf("prism %d %d %d %d %d %d\n",(ulong)uVar2,(ulong)uVar7,(ulong)uVar6,(ulong)uVar3,
         (ulong)uVar4,uVar5);
  printf("tet %d %d %d %d\n",(ulong)local_258,(ulong)local_254,(ulong)local_250,(ulong)local_24c);
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_shard_add_pri_as_tet(REF_NODE ref_node,
                                                   REF_CELL ref_cell,
                                                   REF_INT *nodes,
                                                   REF_BOOL check_volume) {
  REF_INT node;
  REF_GLOB minnode, global[REF_CELL_MAX_SIZE_PER];
  REF_GLOB pri_global[REF_CELL_MAX_SIZE_PER];
  REF_INT pri_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT tet_nodes[REF_CELL_MAX_SIZE_PER];

  for (node = 0; node < 6; node++)
    global[node] = ref_node_global(ref_node, nodes[node]);

  minnode = MIN(MIN(global[0], global[1]), MIN(global[2], global[3]));
  minnode = MIN(MIN(global[4], global[5]), minnode);

  pri_nodes[0] = nodes[0];
  pri_nodes[1] = nodes[1];
  pri_nodes[2] = nodes[2];
  pri_nodes[3] = nodes[3];
  pri_nodes[4] = nodes[4];
  pri_nodes[5] = nodes[5];

  if (global[1] == minnode) {
    pri_nodes[0] = nodes[1];
    pri_nodes[1] = nodes[2];
    pri_nodes[2] = nodes[0];
    pri_nodes[3] = nodes[4];
    pri_nodes[4] = nodes[5];
    pri_nodes[5] = nodes[3];
  }

  if (global[2] == minnode) {
    pri_nodes[0] = nodes[2];
    pri_nodes[1] = nodes[0];
    pri_nodes[2] = nodes[1];
    pri_nodes[3] = nodes[5];
    pri_nodes[4] = nodes[3];
    pri_nodes[5] = nodes[4];
  }

  if (global[3] == minnode) {
    pri_nodes[0] = nodes[3];
    pri_nodes[1] = nodes[5];
    pri_nodes[2] = nodes[4];
    pri_nodes[3] = nodes[0];
    pri_nodes[4] = nodes[2];
    pri_nodes[5] = nodes[1];
  }

  if (global[4] == minnode) {
    pri_nodes[0] = nodes[4];
    pri_nodes[1] = nodes[3];
    pri_nodes[2] = nodes[5];
    pri_nodes[3] = nodes[1];
    pri_nodes[4] = nodes[0];
    pri_nodes[5] = nodes[2];
  }

  if (global[5] == minnode) {
    pri_nodes[0] = nodes[5];
    pri_nodes[1] = nodes[4];
    pri_nodes[2] = nodes[3];
    pri_nodes[3] = nodes[2];
    pri_nodes[4] = nodes[1];
    pri_nodes[5] = nodes[0];
  }

  /* node 0 is now the smallest global index of prism */

  tet_nodes[0] = pri_nodes[0];
  tet_nodes[1] = pri_nodes[4];
  tet_nodes[2] = pri_nodes[5];
  tet_nodes[3] = pri_nodes[3];
  RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "add tet");
  if (check_volume) check_tet_volume();

  for (node = 0; node < 6; node++)
    pri_global[node] = ref_node_global(ref_node, pri_nodes[node]);

  if ((pri_global[1] < pri_global[2] && pri_global[1] < pri_global[4]) ||
      (pri_global[5] < pri_global[2] && pri_global[5] < pri_global[4])) {
    tet_nodes[0] = pri_nodes[0];
    tet_nodes[1] = pri_nodes[1];
    tet_nodes[2] = pri_nodes[5];
    tet_nodes[3] = pri_nodes[4];
    RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
    if (check_volume) check_tet_volume();

    tet_nodes[0] = pri_nodes[0];
    tet_nodes[1] = pri_nodes[1];
    tet_nodes[2] = pri_nodes[2];
    tet_nodes[3] = pri_nodes[5];
    RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
    if (check_volume) check_tet_volume();
  } else {
    tet_nodes[0] = pri_nodes[2];
    tet_nodes[1] = pri_nodes[0];
    tet_nodes[2] = pri_nodes[4];
    tet_nodes[3] = pri_nodes[5];
    RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
    if (check_volume) check_tet_volume();

    tet_nodes[0] = pri_nodes[0];
    tet_nodes[1] = pri_nodes[1];
    tet_nodes[2] = pri_nodes[2];
    tet_nodes[3] = pri_nodes[4];
    RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
    if (check_volume) check_tet_volume();
  }

  return REF_SUCCESS;
}